

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

string * __thiscall JSON::JSONValue::getStringValue_abi_cxx11_(JSONValue *this)

{
  ostream *poVar1;
  allocator<char> local_39;
  string local_38;
  
  if (this->type != STRING) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error requesting JSON string value from ");
    getTypeAsString_abi_cxx11_(&local_38,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_38);
    poVar1 = std::operator<<(poVar1,"in accessor");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    setStringValue(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (string *)this->data;
}

Assistant:

string &JSONValue::getStringValue() {
#ifdef JSON_TYPE_ERRORS_ON
	if(getType()!=STRING)
	{
	cerr << "Error requesting JSON string value from " << getTypeAsString() << "in accessor" << endl;
	setStringValue("");
	}
#endif
	return *((string*)data);
}